

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRHandler.cc
# Opt level: O1

void __thiscall flow::IRHandler::~IRHandler(IRHandler *this)

{
  list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
  *this_00;
  _List_node_base *p_Var1;
  iterator __position;
  _List_node_base *p_Var2;
  iterator __ret;
  _List_node_base *p_Var3;
  
  (this->super_Constant).super_Value._vptr_Value = (_func_int **)&PTR__IRHandler_00196050;
  this_00 = &this->blocks_;
  for (p_Var3 = (this->blocks_).
                super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next; p_Var3 != (_List_node_base *)this_00
      ; p_Var3 = p_Var3->_M_next) {
    p_Var1 = *(_List_node_base **)((long)(p_Var3[1]._M_next + 5) + 8);
    for (p_Var2 = p_Var3[1]._M_next[5]._M_next; p_Var2 != p_Var1;
        p_Var2 = (_List_node_base *)&p_Var2->_M_prev) {
      Instr::clearOperands((Instr *)p_Var2->_M_next);
    }
  }
  while (__position._M_node =
              (this_00->
              super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
              )._M_impl._M_node.super__List_node_base._M_next,
        __position._M_node != (_List_node_base *)this_00) {
    do {
      p_Var3 = (__position._M_node)->_M_next;
      if (__position._M_node[1]._M_next[6]._M_prev == __position._M_node[1]._M_next[7]._M_next) {
        std::__cxx11::
        list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
        ::_M_erase(this_00,__position);
      }
      __position._M_node = p_Var3;
    } while (p_Var3 != (_List_node_base *)this_00);
  }
  std::__cxx11::
  _List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
  ::_M_clear(&this_00->
              super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
            );
  Value::~Value((Value *)this);
  return;
}

Assistant:

IRHandler::~IRHandler() {
  for (BasicBlock* bb : basicBlocks()) {
    for (Instr* instr : bb->instructions()) {
      instr->clearOperands();
    }
  }

  while (!blocks_.empty()) {
    auto i = blocks_.begin();
    auto e = blocks_.end();

    while (i != e) {
      BasicBlock* bb = i->get();

      if (bb->predecessors().empty()) {
        i = blocks_.erase(i);
      } else {
        // skip BBs that other BBs still point to (we never point to ourself).
        ++i;
      }
    }
  }
}